

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::handle_new_expression
          (value *__return_storage_ptr__,impl *this,expression *e)

{
  int iVar1;
  value o;
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  auto_stack_update asu;
  
  o.type_ = undefined;
  args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])(e);
  if (iVar1 == 6) {
    eval((value *)&asu,this,(expression *)e[1].super_syntax_node._vptr_syntax_node);
    value::operator=(&o,(value *)&asu);
    value::~value((value *)&asu);
    eval_argument_list((vector<mjs::value,_std::allocator<mjs::value>_> *)&asu,this,
                       (expression_list *)&e[1].super_syntax_node.extend_);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::_M_move_assign(&args,&asu);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)&asu);
  }
  else {
    eval((value *)&asu,this,e);
    value::operator=(&o,(value *)&asu);
    value::~value((value *)&asu);
  }
  get_value((value *)&asu,this,&o);
  value::operator=(&o,(value *)&asu);
  value::~value((value *)&asu);
  auto_stack_update::auto_stack_update(&asu,this,&(e->super_syntax_node).extend_);
  construct_function(__return_storage_ptr__,&o,(value *)&value::undefined,&args);
  auto_stack_update::~auto_stack_update(&asu);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&args);
  value::~value(&o);
  return __return_storage_ptr__;
}

Assistant:

value handle_new_expression(const expression& e) {
        value o;
        std::vector<value> args;
        if (e.type() == expression_type::call) {
            const auto& ce = static_cast<const call_expression&>(e);
            o = eval(ce.member());
            args = eval_argument_list(ce.arguments());
        } else {
            o = eval(e);
        }
        o = get_value(o);
        try {
            auto_stack_update asu{*this, e.extend()};
            return construct_function(o, value::undefined, args);
        } catch (const not_callable_exception&) {
            std::wostringstream woss;
            if (o.type() != value_type::object) {
                woss << to_string(heap_, o).view() << " is not an object";
            } else {
                // TODO: Could get function name here at some point
                woss << o.object_value()->class_name().view() << " is not constructable";
            }            
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
    }